

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O0

void quicly_local_cid_init_set
               (quicly_local_cid_set_t *set,quicly_cid_encryptor_t *encryptor,
               quicly_cid_plaintext_t *new_cid)

{
  undefined8 *in_RDX;
  long in_RSI;
  quicly_local_cid_set_t *in_RDI;
  size_t i;
  ulong local_120;
  undefined1 local_118 [240];
  undefined8 local_28;
  long local_20;
  undefined8 *local_18;
  long local_10;
  quicly_local_cid_set_t *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_118,0,0x100);
  local_28 = 1;
  local_20 = local_10;
  memcpy(in_RDI,local_118,0x100);
  if (local_18 != (undefined8 *)0x0) {
    if ((*(uint *)((long)local_18 + 4) & 0xff) != 0) {
      __assert_fail("new_cid->path_id == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                    ,0x56,
                    "void quicly_local_cid_init_set(quicly_local_cid_set_t *, quicly_cid_encryptor_t *, const quicly_cid_plaintext_t *)"
                   );
    }
    *(undefined8 *)&local_8->plaintext = *local_18;
    (local_8->plaintext).node_id = local_18[1];
  }
  if (local_10 != 0) {
    if (local_18 == (undefined8 *)0x0) {
      __assert_fail("new_cid != NULL && \"master CID must be specified when a non-zero length CID is to be used\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                    ,0x5c,
                    "void quicly_local_cid_init_set(quicly_local_cid_set_t *, quicly_cid_encryptor_t *, const quicly_cid_plaintext_t *)"
                   );
    }
    generate_cid(in_RDI,0x12f66a);
  }
  local_8->cids[0].state = QUICLY_LOCAL_CID_STATE_DELIVERED;
  for (local_120 = 1; local_120 < 4; local_120 = local_120 + 1) {
    local_8->cids[local_120].sequence = 0xffffffffffffffff;
  }
  return;
}

Assistant:

void quicly_local_cid_init_set(quicly_local_cid_set_t *set, quicly_cid_encryptor_t *encryptor,
                               const quicly_cid_plaintext_t *new_cid)
{
    *set = (quicly_local_cid_set_t){
        ._encryptor = encryptor,
        ._size = 1,
    };

    /* if provided, set master id */
    if (new_cid != NULL) {
        assert(new_cid->path_id == 0);
        set->plaintext = *new_cid;
    }

    /* initialize cids[0] */
    if (encryptor != NULL) {
        assert(new_cid != NULL && "master CID must be specified when a non-zero length CID is to be used");
        generate_cid(set, 0);
    }
    set->cids[0].state =
        QUICLY_LOCAL_CID_STATE_DELIVERED; /* no need to use NCID frames, the use delivers this CID to the remote peer */

    for (size_t i = 1; i < PTLS_ELEMENTSOF(set->cids); i++)
        set->cids[i].sequence = UINT64_MAX;
}